

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::String>::truncate(ArrayBuilder<kj::String> *this,char *__file,__off_t __length)

{
  String *pSVar1;
  String *pSVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  String *pSVar6;
  
  pSVar2 = this->ptr;
  pSVar1 = this->pos;
  while (pSVar6 = pSVar1, pSVar2 + (long)__file < pSVar6) {
    pSVar1 = pSVar6 + -1;
    this->pos = pSVar1;
    pcVar3 = pSVar6[-1].content.ptr;
    if (pcVar3 != (char *)0x0) {
      sVar4 = pSVar6[-1].content.size_;
      (pSVar1->content).ptr = (char *)0x0;
      pSVar6[-1].content.size_ = 0;
      pAVar5 = pSVar6[-1].content.disposer;
      (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar3,1,sVar4,sVar4,0);
      pSVar1 = this->pos;
    }
  }
  return (int)pSVar6;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }